

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# connection2.c
# Opt level: O0

void ssh2_got_user_input(ConnectionLayer *cl)

{
  size_t sVar1;
  bool bVar2;
  ptrlen pVar3;
  void *local_28;
  ptrlen data;
  ssh2_connection_state *s;
  ConnectionLayer *cl_local;
  
  while( true ) {
    bVar2 = false;
    if (cl[-0xc].logctx != (LogContext *)0x0) {
      sVar1 = bufchain_size((bufchain *)cl[-10].vt);
      bVar2 = sVar1 != 0;
    }
    if (!bVar2) break;
    pVar3 = bufchain_prefix((bufchain *)cl[-10].vt);
    local_28 = pVar3.ptr;
    data.ptr = (void *)pVar3.len;
    sshfwd_write((SshChannel *)cl[-0xc].vt,local_28,(size_t)data.ptr);
    bufchain_consume((bufchain *)cl[-10].vt,(size_t)data.ptr);
  }
  return;
}

Assistant:

static void ssh2_got_user_input(ConnectionLayer *cl)
{
    struct ssh2_connection_state *s =
        container_of(cl, struct ssh2_connection_state, cl);

    while (s->mainchan && bufchain_size(s->user_input) > 0) {
        /*
         * Add user input to the main channel's buffer.
         */
        ptrlen data = bufchain_prefix(s->user_input);
        sshfwd_write(s->mainchan_sc, data.ptr, data.len);
        bufchain_consume(s->user_input, data.len);
    }
}